

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpFixedLengthEntityReader::tryRead
          (HttpFixedLengthEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  size_t minBytes_00;
  long lVar1;
  bool bVar2;
  byte extraout_AL;
  undefined8 *puVar3;
  Coroutine<unsigned_long> *this_00;
  HttpInputStreamImpl *buffer_00;
  Promise<unsigned_long> *promise;
  unsigned_long uVar4;
  size_t *psVar5;
  ulong *puVar6;
  unsigned_long *a;
  unsigned_long *params_1;
  ulong *puVar7;
  PromiseAwaiter<unsigned_long> *__return_storage_ptr__;
  HttpInputStreamImpl *this_01;
  Exception *this_02;
  String *__return_storage_ptr___00;
  unsigned_long in_R8;
  unsigned_long *in_R9;
  void *pvVar8;
  void *in_stack_fffffffffffff860;
  int local_770;
  int local_738;
  Fault local_2b8;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  HttpFixedLengthEntityReader *this_local;
  
  puVar3 = (undefined8 *)operator_new(0x618);
  *puVar3 = tryRead;
  puVar3[1] = tryRead;
  psVar5 = puVar3 + 0xb8;
  puVar6 = puVar3 + 0xb9;
  a = puVar3 + 0xba;
  params_1 = puVar3 + 0xbc;
  puVar7 = puVar3 + 0xbd;
  __return_storage_ptr__ = (PromiseAwaiter<unsigned_long> *)(puVar3 + 0x48);
  this_01 = (HttpInputStreamImpl *)(puVar3 + 0xbe);
  this_02 = (Exception *)(puVar3 + 0x80);
  __return_storage_ptr___00 = (String *)(puVar3 + 0xb5);
  this_00 = (Coroutine<unsigned_long> *)(puVar3 + 2);
  puVar3[0xc1] = buffer;
  *psVar5 = minBytes;
  *puVar6 = maxBytes;
  *a = in_R8;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar3 + 0xb2),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"tryRead",0x7c5,0x13);
  pvVar8 = (void *)puVar3[0xb4];
  kj::_::Coroutine<unsigned_long>::Coroutine(this_00,*(SourceLocation *)(puVar3 + 0xb2));
  kj::_::Coroutine<unsigned_long>::get_return_object((Coroutine<unsigned_long> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar2 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar3 + 0x615));
  if (bVar2) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar3 + 0x615));
    f.exception = (Exception *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                             (bool *)(puVar3[0xc1] + 0x20));
    bVar2 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&f);
    if (!bVar2) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&,char_const(&)[59]>
                (&local_2b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x7c6,FAILED,"clean",
                 "_kjCondition,\"can\'t read more data after a previous read didn\'t complete\"",
                 (DebugExpression<bool_&> *)&f,
                 (char (*) [59])"can\'t read more data after a previous read didn\'t complete");
      kj::_::Debug::Fault::fatal(&local_2b8);
    }
    *(undefined1 *)(puVar3[0xc1] + 0x20) = 0;
    *params_1 = 0;
    do {
      if (*(long *)(puVar3[0xc1] + 0x18) == 0) {
        *(undefined1 *)(puVar3[0xc1] + 0x20) = 1;
        kj::_::CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long>::return_value
                  ((CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long> *)this_00,0);
        local_738 = 3;
        goto LAB_006378fe;
      }
      buffer_00 = HttpEntityBodyReader::getInner((HttpEntityBodyReader *)puVar3[0xc1]);
      minBytes_00 = *psVar5;
      min<unsigned_long&,unsigned_long&>(a,(unsigned_long *)(puVar3[0xc1] + 0x18));
      HttpInputStreamImpl::tryRead(this_01,buffer_00,minBytes_00,1);
      promise = kj::_::Coroutine<unsigned_long>::await_transform<kj::Promise<unsigned_long>>
                          (this_00,(Promise<unsigned_long> *)this_01);
      co_await<unsigned_long>(__return_storage_ptr__,promise);
      bVar2 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
      if (!bVar2) {
        *(undefined1 *)((long)puVar3 + 0x614) = 1;
        _GLOBAL__N_1::HttpFixedLengthEntityReader::tryRead(in_stack_fffffffffffff860,pvVar8);
        if ((extraout_AL & 1) != 0) {
          return (PromiseBase)(PromiseBase)this;
        }
      }
      uVar4 = kj::_::PromiseAwaiter<unsigned_long>::await_resume(__return_storage_ptr__);
      puVar3[0xbf] = uVar4;
      kj::_::PromiseAwaiter<unsigned_long>::~PromiseAwaiter(__return_storage_ptr__);
      Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)this_01);
      lVar1 = puVar3[0xc1];
      *puVar7 = puVar3[0xbf];
      *(ulong *)(lVar1 + 0x18) = *(long *)(lVar1 + 0x18) - *puVar7;
      if (*(long *)(lVar1 + 0x18) == 0) {
        if (*(long *)(puVar3[0xc1] + 0x18) == 0) {
          HttpEntityBodyReader::doneReading((HttpEntityBodyReader *)puVar3[0xc1]);
        }
LAB_00637889:
        *(undefined1 *)(puVar3[0xc1] + 0x20) = 1;
        kj::_::CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long>::return_value
                  ((CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long> *)this_00,
                   *puVar7 + *params_1);
        local_770 = 3;
      }
      else {
        if (*puVar7 == 0) {
          *(unsigned_long *)*(char (*) [64])(puVar3 + 0xc0) =
               *(long *)(puVar3[0xc1] + 0x18) + *params_1;
          kj::_::Debug::makeDescription<char_const(&)[64],unsigned_long&,unsigned_long&>
                    (__return_storage_ptr___00,
                     (Debug *)
                     "\"premature EOF in HTTP entity body; did not reach Content-Length\", expectedLength, alreadyRead"
                     ,"premature EOF in HTTP entity body; did not reach Content-Length",
                     (char (*) [64])(puVar3 + 0xc0),params_1,in_R9);
          Exception::Exception
                    (this_02,DISCONNECTED,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0x7df,__return_storage_ptr___00);
          throwRecoverableException(this_02,0);
          Exception::~Exception(this_02);
          String::~String(__return_storage_ptr___00);
          goto LAB_00637889;
        }
        if (*puVar6 <= *puVar7) goto LAB_00637889;
        *psVar5 = *psVar5 + *puVar7;
        *puVar6 = *puVar6 - *puVar7;
        *a = *a - *puVar7;
        *params_1 = *puVar7 + *params_1;
        local_770 = 8;
      }
    } while (local_770 == 8);
    local_738 = local_770;
LAB_006378fe:
    if (local_738 == 3) {
      kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
      bVar2 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x616));
      if (!bVar2) {
        *puVar3 = 0;
        *(undefined1 *)((long)puVar3 + 0x614) = 2;
        _GLOBAL__N_1::HttpFixedLengthEntityReader::tryRead(in_stack_fffffffffffff860,pvVar8);
        return (PromiseBase)(PromiseBase)this;
      }
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x616));
    }
    kj::_::Coroutine<unsigned_long>::~Coroutine(this_00);
    if (puVar3 != (undefined8 *)0x0) {
      operator_delete(puVar3,0x618);
    }
  }
  else {
    *(undefined1 *)((long)puVar3 + 0x614) = 0;
    _GLOBAL__N_1::HttpFixedLengthEntityReader::tryRead(in_stack_fffffffffffff860,pvVar8);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_REQUIRE(clean, "can't read more data after a previous read didn't complete");
    clean = false;

    size_t alreadyRead = 0;

    for (;;) {
      if (length == 0) {
        clean = true;
        co_return 0;
      }

      // We have to set minBytes to 1 here so that if we read any data at all, we update our
      // counter immediately, so that we still know where we are in case of cancellation.
      auto amount = co_await getInner().tryRead(buffer, 1, kj::min(maxBytes, length));

      length -= amount;
      if (length > 0) {
        // We haven't reached the end of the entity body yet.
        if (amount == 0) {
          size_t expectedLength = length + alreadyRead;
          kj::throwRecoverableException(KJ_EXCEPTION(
            DISCONNECTED,
            "premature EOF in HTTP entity body; did not reach Content-Length",
            expectedLength,
            alreadyRead
          ));
        } else if (amount < minBytes) {
          // We requested a minimum 1 byte above, but our own caller actually set a larger minimum
          // which has not yet been reached. Keep trying until we reach it.
          buffer = reinterpret_cast<byte*>(buffer) + amount;
          minBytes -= amount;
          maxBytes -= amount;
          alreadyRead += amount;
          continue;
        }
      } else if (length == 0) {
        doneReading();
      }
      clean = true;
      co_return amount + alreadyRead;
    }
  }